

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O2

Mat * IntArrayMat(Mat *__return_storage_ptr__,int a0)

{
  ncnn::Mat::Mat(__return_storage_ptr__,1,4,(Allocator *)0x0);
  *(int *)__return_storage_ptr__->data = a0;
  return __return_storage_ptr__;
}

Assistant:

static ncnn::Mat IntArrayMat(int a0)
{
    ncnn::Mat m(1);
    int* p = m;
    p[0] = a0;
    return m;
}